

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

JavascriptExternalFunction * __thiscall
Js::JavascriptLibrary::CreateStdCallExternalFunction
          (JavascriptLibrary *this,StdCallJavascriptMethod entryPoint,Var name,void *callbackState)

{
  JavascriptExternalFunction *this_00;
  
  this_00 = CreateIdMappedExternalFunction<void*(*)(void*,void**,unsigned_short,Js::StdCallJavascriptMethodInfo*,void*)>
                      (this,(_func_void_ptr_void_ptr_void_ptr_ptr_unsigned_short_StdCallJavascriptMethodInfo_ptr_void_ptr
                             *)entryPoint,(this->stdCallFunctionWithDeferredPrototypeType).ptr);
  RuntimeFunction::SetFunctionNameId(&this_00->super_RuntimeFunction,name);
  Memory::Recycler::WBSetBit((char *)&this_00->callbackState);
  (this_00->callbackState).ptr = callbackState;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this_00->callbackState);
  return this_00;
}

Assistant:

JavascriptExternalFunction* JavascriptLibrary::CreateStdCallExternalFunction(StdCallJavascriptMethod entryPoint, Var name, void *callbackState)
    {
        JavascriptExternalFunction* function = this->CreateIdMappedExternalFunction(entryPoint, stdCallFunctionWithDeferredPrototypeType);
        function->SetFunctionNameId(name);
        function->SetCallbackState(callbackState);
        return function;
    }